

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

void nk_buffer_info(nk_memory_status *s,nk_buffer *b)

{
  nk_size nVar1;
  
  if (b == (nk_buffer *)0x0) {
    __assert_fail("b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x158e,"void nk_buffer_info(struct nk_memory_status *, struct nk_buffer *)");
  }
  if (s != (nk_memory_status *)0x0) {
    s->size = (b->memory).size;
    nVar1 = b->needed;
    s->allocated = b->allocated;
    s->needed = nVar1;
    s->memory = (b->memory).ptr;
    s->calls = b->calls;
    return;
  }
  __assert_fail("s",
                "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                ,0x158f,"void nk_buffer_info(struct nk_memory_status *, struct nk_buffer *)");
}

Assistant:

NK_API void
nk_buffer_info(struct nk_memory_status *s, struct nk_buffer *b)
{
    NK_ASSERT(b);
    NK_ASSERT(s);
    if (!s || !b) return;
    s->allocated = b->allocated;
    s->size =  b->memory.size;
    s->needed = b->needed;
    s->memory = b->memory.ptr;
    s->calls = b->calls;
}